

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall
QTextCursor::insertMarkdown(QTextCursor *this,QString *markdown,MarkdownFeatures features)

{
  char cVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  long in_FS_OFFSET;
  QLatin1StringView local_70;
  QTextDocumentFragment fragment;
  QArrayDataPointer<char16_t> local_58;
  QTextDocument local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      fragment.d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QTextDocumentFragment::fromMarkdown(&fragment,markdown,features);
      cVar1 = QString::startsWith((QChar)(char16_t)markdown,10);
      if (cVar1 != '\0') {
        QTextDocument::firstBlock(&local_40);
        QTextBlock::blockFormat((QTextBlock *)&local_58);
        insertBlock(this,(QTextBlockFormat *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_58);
      }
      insertFragment(this,&fragment);
      bVar2 = atEnd(this);
      if (!bVar2) {
        cVar1 = QString::endsWith((QChar)(char16_t)markdown,10);
        if (cVar1 != '\0') {
          QLatin1String::QLatin1String(&local_70,"\n");
          QString::QString((QString *)&local_58,local_70);
          insertText(this,(QString *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        }
      }
      QTextDocumentFragment::~QTextDocumentFragment(&fragment);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertMarkdown(const QString &markdown, QTextDocument::MarkdownFeatures features)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromMarkdown(markdown, features);
    if (markdown.startsWith(QLatin1Char('\n')))
        insertBlock(fragment.d->doc->firstBlock().blockFormat());
    insertFragment(fragment);
    if (!atEnd() && markdown.endsWith(QLatin1Char('\n')))
        insertText(QLatin1String("\n"));
}